

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merged-constraint.cpp
# Opt level: O0

vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_> *
baryonyx::itm::make_merged_constraints
          (vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
           *__return_storage_ptr__,context *ctx,problem *pb)

{
  int iVar1;
  problem *ctx_00;
  size_type sVar2;
  size_type sVar3;
  size_type sVar4;
  size_t size;
  tuple<double,_baryonyx::show_size_type> *mem;
  baryonyx local_d0 [16];
  string local_c0;
  int local_9c;
  vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
  local_98;
  vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
  local_80;
  vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
  local_68;
  vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
  local_50;
  undefined1 local_25;
  int local_24;
  problem *ppStack_20;
  int original_nb;
  problem *pb_local;
  context *ctx_local;
  vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_> *ret;
  
  ppStack_20 = pb;
  pb_local = (problem *)ctx;
  ctx_local = (context *)__return_storage_ptr__;
  info<baryonyx::solver_parameters::pre_constraint_order>
            (ctx,"  - merge constraint according to the `{}` algorithm\n",
             &(ctx->parameters).pre_order);
  sVar2 = std::vector<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>::size
                    (&ppStack_20->equal_constraints);
  sVar3 = std::vector<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>::size
                    (&ppStack_20->less_constraints);
  sVar4 = std::vector<baryonyx::constraint,_std::allocator<baryonyx::constraint>_>::size
                    (&ppStack_20->greater_constraints);
  local_24 = (int)sVar2 + (int)sVar3 + (int)sVar4;
  local_25 = 0;
  std::vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>::
  vector(__return_storage_ptr__);
  std::vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>::
  reserve(__return_storage_ptr__,(long)local_24);
  switch(*(undefined4 *)
          &(pb_local->affected_vars).names.
           super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish) {
  case 0:
    make_unsorted_merged_constraints(&local_50,(context *)pb_local,ppStack_20);
    std::vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
    ::operator=(__return_storage_ptr__,&local_50);
    std::vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
    ::~vector(&local_50);
    break;
  case 1:
    make_unsorted_merged_constraints(&local_68,(context *)pb_local,ppStack_20);
    std::vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
    ::operator=(__return_storage_ptr__,&local_68);
    std::vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
    ::~vector(&local_68);
    improve_memory_usage(__return_storage_ptr__);
    break;
  case 2:
  case 3:
  case 4:
  case 5:
  case 6:
  case 7:
    make_ordered_merged_constraints(&local_80,(context *)pb_local,ppStack_20);
    std::vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
    ::operator=(__return_storage_ptr__,&local_80);
    std::vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
    ::~vector(&local_80);
    improve_memory_usage(__return_storage_ptr__);
    break;
  case 8:
  case 9:
  case 10:
  case 0xb:
    make_special_merged_constraints(&local_98,(context *)pb_local,ppStack_20);
    std::vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
    ::operator=(__return_storage_ptr__,&local_98);
    std::vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
    ::~vector(&local_98);
  }
  ctx_00 = pb_local;
  iVar1 = local_24;
  sVar2 = std::
          vector<baryonyx::itm::merged_constraint,_std::allocator<baryonyx::itm::merged_constraint>_>
          ::size(__return_storage_ptr__);
  local_9c = iVar1 - (int)sVar2;
  size = memory_consumed(ppStack_20);
  memory_consumed_size<unsigned_long>(local_d0,size);
  to_string_abi_cxx11_(&local_c0,local_d0,mem);
  info<int,std::__cxx11::string>
            ((context *)ctx_00,"  - merged constraints removed: {}\n  - problem memory used: {}\n",
             &local_9c,&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  return __return_storage_ptr__;
}

Assistant:

std::vector<merged_constraint>
make_merged_constraints(const context& ctx, const problem& pb)
{
    info(ctx,
         "  - merge constraint according to the `{}` algorithm\n",
         ctx.parameters.pre_order);

    auto original_nb = static_cast<int>(pb.equal_constraints.size() +
                                        pb.less_constraints.size() +
                                        pb.greater_constraints.size());

    std::vector<merged_constraint> ret;
    ret.reserve(original_nb);

    switch (ctx.parameters.pre_order) {
    case solver_parameters::pre_constraint_order::none:
        ret = make_unsorted_merged_constraints(ctx, pb);
        break;
    case solver_parameters::pre_constraint_order::memory:
        ret = make_unsorted_merged_constraints(ctx, pb);
        improve_memory_usage(ret);
        break;
    case solver_parameters::pre_constraint_order::less_greater_equal:
    case solver_parameters::pre_constraint_order::less_equal_greater:
    case solver_parameters::pre_constraint_order::greater_less_equal:
    case solver_parameters::pre_constraint_order::greater_equal_less:
    case solver_parameters::pre_constraint_order::equal_less_greater:
    case solver_parameters::pre_constraint_order::equal_greater_less:
        ret = make_ordered_merged_constraints(ctx, pb);
        improve_memory_usage(ret);
        break;
    case solver_parameters::pre_constraint_order::p1:
    case solver_parameters::pre_constraint_order::p2:
    case solver_parameters::pre_constraint_order::p3:
    case solver_parameters::pre_constraint_order::p4:
        ret = make_special_merged_constraints(ctx, pb);
        break;
    }

    info(ctx,
         "  - merged constraints removed: {}\n"
         "  - problem memory used: {}\n",
         original_nb - static_cast<int>(ret.size()),
         to_string(memory_consumed_size(memory_consumed(pb))));

    return ret;
}